

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-mmsg.c
# Opt level: O2

int run_test_udp_mmsg(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  int64_t eval_b;
  int64_t eval_b_6;
  int64_t eval_a;
  undefined8 local_40;
  sockaddr_in addr;
  
  eval_a = 0;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  eval_b = (int64_t)iVar1;
  if (eval_a == eval_b) {
    eval_a = 0;
    uVar3 = uv_default_loop();
    iVar1 = uv_udp_init_ex(uVar3,&recver,0x100);
    eval_b = (int64_t)iVar1;
    if (eval_a == eval_b) {
      eval_a = 0;
      iVar1 = uv_udp_bind(&recver,&addr,0);
      eval_b = (int64_t)iVar1;
      if (eval_a == eval_b) {
        eval_a = 0;
        iVar1 = uv_udp_recv_start(&recver,alloc_cb,recv_cb);
        eval_b = (int64_t)iVar1;
        if (eval_a == eval_b) {
          eval_a = 0;
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          eval_b = (int64_t)iVar1;
          if (eval_a == eval_b) {
            eval_a = 0;
            uVar3 = uv_default_loop();
            iVar1 = uv_udp_init(uVar3,&sender);
            eval_b = (int64_t)iVar1;
            if (eval_a == eval_b) {
              auVar8 = uv_buf_init("PING",4);
              iVar1 = 8;
              do {
                local_40 = auVar8._8_8_;
                eval_a = auVar8._0_8_;
                bVar7 = iVar1 == 0;
                iVar1 = iVar1 + -1;
                if (bVar7) {
                  eval_b = 0;
                  uVar3 = uv_default_loop();
                  iVar1 = uv_run(uVar3,0);
                  eval_b_6 = (int64_t)iVar1;
                  if (eval_b_6 != 0) {
                    pcVar6 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                    pcVar5 = "0";
                    uVar3 = 0x7c;
                    sVar4 = eval_b;
                    goto LAB_0016ff00;
                  }
                  sVar4 = (size_t)close_cb_called;
                  eval_b_6 = 2;
                  if (sVar4 != 2) {
                    pcVar6 = "2";
                    pcVar5 = "close_cb_called";
                    uVar3 = 0x7e;
                    goto LAB_0016ff00;
                  }
                  sVar4 = (size_t)recv_cb_called;
                  eval_b_6 = 8;
                  if (sVar4 != 8) {
                    pcVar6 = "8";
                    pcVar5 = "recv_cb_called";
                    uVar3 = 0x7f;
                    goto LAB_0016ff00;
                  }
                  eval_b_6 = 0;
                  if (sender.send_queue_size != 0) {
                    pcVar6 = "0";
                    pcVar5 = "sender.send_queue_size";
                    uVar3 = 0x81;
                    sVar4 = sender.send_queue_size;
                    goto LAB_0016ff00;
                  }
                  eval_b_6 = 0;
                  if (recver.send_queue_size != 0) {
                    pcVar6 = "0";
                    pcVar5 = "recver.send_queue_size";
                    uVar3 = 0x82;
                    sVar4 = recver.send_queue_size;
                    goto LAB_0016ff00;
                  }
                  printf("%d allocs for %d recvs\n",(ulong)(uint)alloc_cb_called);
                  iVar1 = uv_udp_using_recvmmsg(&recver);
                  if (iVar1 == 0) {
                    sVar4 = (size_t)alloc_cb_called;
                    eval_b_6 = (int64_t)recv_cb_called;
                    if (sVar4 != eval_b_6) {
                      pcVar6 = "recv_cb_called";
                      pcVar5 = "alloc_cb_called";
                      uVar3 = 0x8a;
                      goto LAB_0016ff00;
                    }
                  }
                  else {
                    sVar4 = (size_t)alloc_cb_called;
                    eval_b_6 = 2;
                    if (sVar4 != 2) {
                      pcVar6 = "(8 / 4)";
                      pcVar5 = "alloc_cb_called";
                      uVar3 = 0x88;
                      goto LAB_0016ff00;
                    }
                  }
                  uVar3 = uv_default_loop();
                  uv_walk(uVar3,close_walk_cb,0);
                  uv_run(uVar3,0);
                  uVar3 = uv_default_loop();
                  iVar1 = uv_loop_close(uVar3);
                  if (iVar1 != 0) {
                    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
                            ,0x8c,"0 == uv_loop_close(uv_default_loop())");
                    abort();
                  }
                  uv_library_shutdown();
                  return 0;
                }
                eval_b = 4;
                iVar2 = uv_udp_try_send(&sender,&eval_a,1,&addr);
                auVar8._8_8_ = local_40;
                auVar8._0_8_ = eval_a;
                eval_b_6 = (int64_t)iVar2;
              } while (eval_b_6 == 4);
              pcVar6 = "uv_udp_try_send(&sender, &buf, 1, (const struct sockaddr*) &addr)";
              pcVar5 = "4";
              uVar3 = 0x79;
              sVar4 = eval_b;
              goto LAB_0016ff00;
            }
            pcVar6 = "uv_udp_init(uv_default_loop(), &sender)";
            uVar3 = 0x75;
          }
          else {
            pcVar6 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
            uVar3 = 0x73;
          }
        }
        else {
          pcVar6 = "uv_udp_recv_start(&recver, alloc_cb, recv_cb)";
          uVar3 = 0x71;
        }
      }
      else {
        pcVar6 = "uv_udp_bind(&recver, (const struct sockaddr*) &addr, 0)";
        uVar3 = 0x6f;
      }
    }
    else {
      pcVar6 = "uv_udp_init_ex(uv_default_loop(), &recver, 0 | UV_UDP_RECVMMSG)";
      uVar3 = 0x6d;
    }
  }
  else {
    pcVar6 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar3 = 0x6a;
  }
  pcVar5 = "0";
  sVar4 = eval_a;
  eval_b_6 = eval_b;
LAB_0016ff00:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
          ,uVar3,pcVar5,"==",pcVar6,sVar4,"==",eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(udp_mmsg) {
  struct sockaddr_in addr;
  uv_buf_t buf;
  int i;

  ASSERT_EQ(0, uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  ASSERT_EQ(0, uv_udp_init_ex(uv_default_loop(), &recver,
                              AF_UNSPEC | UV_UDP_RECVMMSG));

  ASSERT_EQ(0, uv_udp_bind(&recver, (const struct sockaddr*) &addr, 0));

  ASSERT_EQ(0, uv_udp_recv_start(&recver, alloc_cb, recv_cb));

  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_EQ(0, uv_udp_init(uv_default_loop(), &sender));

  buf = uv_buf_init("PING", 4);
  for (i = 0; i < NUM_SENDS; i++) {
    ASSERT_EQ(4, uv_udp_try_send(&sender, &buf, 1, (const struct sockaddr*) &addr));
  }

  ASSERT_EQ(0, uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(close_cb_called, 2);
  ASSERT_EQ(recv_cb_called, NUM_SENDS);

  ASSERT_EQ(sender.send_queue_size, 0);
  ASSERT_EQ(recver.send_queue_size, 0);

  printf("%d allocs for %d recvs\n", alloc_cb_called, recv_cb_called);

  /* On platforms that don't support mmsg, each recv gets its own alloc */
  if (uv_udp_using_recvmmsg(&recver))
    ASSERT_EQ(alloc_cb_called, EXPECTED_MMSG_ALLOCS);
  else
    ASSERT_EQ(alloc_cb_called, recv_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}